

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::ExcludesError::ExcludesError(ExcludesError *this,string *msg,ExitCodes exit_code)

{
  undefined4 in_EDX;
  string *in_RSI;
  undefined8 *in_RDI;
  string local_70 [16];
  allocator<char> *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [20];
  ExitCodes in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  string *this_00;
  
  this_00 = in_RSI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  ::std::__cxx11::string::string(local_70,in_RSI);
  ParseError::ParseError
            ((ParseError *)this_00,(string *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
             in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string(local_38);
  ::std::allocator<char>::~allocator(&local_39);
  *in_RDI = &PTR__ExcludesError_0037bbd8;
  return;
}

Assistant:

ExcludesError(std::string curname, std::string subname)
        : ExcludesError(curname + " excludes " + subname, ExitCodes::ExcludesError) {}